

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Escape::CGraph::writeBinaryFile(CGraph *this,char *path)

{
  char cVar1;
  ofstream out_file;
  long local_210;
  filebuf local_208 [24];
  int aiStack_1f0 [54];
  ios_base local_118 [264];
  
  std::ofstream::ofstream(&local_210,path,_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    printf("Could not write to the file %s",path);
  }
  else {
    std::ostream::write((char *)&local_210,(long)this);
    std::ostream::write((char *)&local_210,(long)&this->nEdges);
    std::ostream::write((char *)&local_210,(long)this->offsets);
    std::ostream::write((char *)&local_210,(long)this->nbors);
    std::ofstream::close();
    if (*(int *)((long)aiStack_1f0 + *(long *)(local_210 + -0x18)) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error occurred at writing time!",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
    }
  }
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _strftime;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void CGraph::writeBinaryFile(const char *path) {
    auto out_file = std::ofstream(path, std::ios::out | std::ios::binary);
    if ( !out_file.is_open() ) {
        printf("Could not write to the file %s",path);
        return;
    }
    out_file.write(reinterpret_cast<const char*>(&nVertices), sizeof(nVertices));
    out_file.write(reinterpret_cast<const char*>(&nEdges), sizeof(nEdges));
    out_file.write(reinterpret_cast<const char*>(offsets), std::streamsize((nVertices+1)* sizeof(VertexIdx)));
    out_file.write(reinterpret_cast<const char*>(nbors), nEdges*sizeof(EdgeIdx));
    out_file.close();
    if(!out_file.good()) {
        std::cout << "Error occurred at writing time!" << std::endl;
    }
}